

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_index
          (Arg *__return_storage_ptr__,BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s
          )

{
  uint arg_index;
  FormatError *this_00;
  CStringRef message;
  char *error;
  char *local_20;
  
  local_20 = (char *)0x0;
  if ((byte)(**s - 0x3aU) < 0xf6) {
    internal::FormatterBase::next_arg(__return_storage_ptr__,&this->super_FormatterBase,&local_20);
  }
  else {
    arg_index = internal::parse_nonnegative_int<char>(s);
    internal::FormatterBase::get_arg
              (__return_storage_ptr__,&this->super_FormatterBase,arg_index,&local_20);
  }
  if (local_20 != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    message.data_ = local_20;
    if ((**s != '}') && (**s != ':')) {
      message.data_ = "invalid format string";
    }
    FormatError::FormatError(this_00,message);
    __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_index(const Char *&s)
{
    const char *error = FMT_NULL;
    internal::Arg arg = *s < '0' || *s > '9' ? next_arg(error) : get_arg(internal::parse_nonnegative_int(s), error);
    if (error)
    {
        FMT_THROW(FormatError(*s != '}' && *s != ':' ? "invalid format string" : error));
    }
    return arg;
}